

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_union.c
# Opt level: O1

void array_run_container_union(array_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  ushort uVar1;
  int iVar2;
  rle16_t *prVar3;
  bool bVar4;
  rle16_t rVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  rle16_t rVar11;
  rle16_t rVar12;
  uint uVar13;
  rle16_t rVar14;
  rle16_t rVar15;
  uint uVar16;
  
  if (((src_2->n_runs == 1) && (src_2->runs->value == 0)) && (src_2->runs->length == 0xffff)) {
    run_container_copy(src_2,dst);
    return;
  }
  run_container_grow(dst,(src_2->n_runs + src_1->cardinality) * 2,false);
  uVar1 = *src_1->array;
  bVar4 = src_2->runs->value <= uVar1;
  if (bVar4) {
    rVar5 = *src_2->runs;
    dst->runs[dst->n_runs] = rVar5;
    dst->n_runs = dst->n_runs + 1;
  }
  else {
    rVar5.length = 0;
    rVar5.value = uVar1;
    prVar3 = dst->runs;
    iVar2 = dst->n_runs;
    prVar3[iVar2].value = uVar1;
    prVar3[iVar2].length = 0;
    dst->n_runs = iVar2 + 1;
  }
  uVar9 = (uint)!bVar4;
  uVar7 = (uint)bVar4;
  uVar6 = (uint)rVar5 >> 0x10;
  while (((int)uVar7 < src_2->n_runs && ((int)uVar9 < src_1->cardinality))) {
    uVar1 = src_1->array[(int)uVar9];
    rVar12.length = 0;
    rVar12.value = uVar1;
    uVar10 = (uint)rVar5 & 0xffff;
    uVar16 = uVar6 & 0xffff;
    if (uVar1 < src_2->runs[(int)uVar7].value) {
      uVar16 = uVar16 + uVar10 + 1;
      if (uVar16 < uVar1) {
        rVar14.length = 0;
        rVar14.value = uVar1;
        dst->runs[dst->n_runs] = rVar14;
        dst->n_runs = dst->n_runs + 1;
        uVar6 = 0;
        rVar5 = rVar12;
      }
      else if (uVar16 == uVar1) {
        uVar6 = uVar6 + 1;
        dst->runs[(long)dst->n_runs + -1] = (rle16_t)(uVar6 * 0x10000 | uVar10);
      }
      uVar9 = uVar9 + 1;
    }
    else {
      rVar12 = src_2->runs[(int)uVar7];
      if (uVar10 + uVar16 + 1 < ((uint)rVar12 & 0xffff)) {
        prVar3 = dst->runs;
        iVar2 = dst->n_runs;
        prVar3[iVar2].value = rVar12.value;
        prVar3[iVar2].length = rVar12.length;
        dst->n_runs = iVar2 + 1;
        rVar5 = rVar12;
        uVar6 = (uint)rVar12 >> 0x10;
      }
      else {
        uVar13 = ((uint)rVar12 & 0xffff) + ((uint)rVar12 >> 0x10);
        if (uVar16 + uVar10 <= uVar13) {
          uVar6 = uVar13 - uVar10;
          dst->runs[(long)dst->n_runs + -1] = (rle16_t)(uVar6 * 0x10000 | uVar10);
        }
      }
      uVar7 = uVar7 + 1;
    }
  }
  if ((int)uVar9 < src_1->cardinality) {
    if ((int)uVar9 < src_1->cardinality) {
      lVar8 = (long)(int)uVar9;
      do {
        uVar1 = src_1->array[lVar8];
        rVar11.length = 0;
        rVar11.value = uVar1;
        uVar7 = (uVar6 & 0xffff) + ((uint)rVar5 & 0xffff) + 1;
        if (uVar7 < uVar1) {
          rVar15.length = 0;
          rVar15.value = uVar1;
          dst->runs[dst->n_runs] = rVar15;
          dst->n_runs = dst->n_runs + 1;
          uVar6 = 0;
          rVar5 = rVar11;
        }
        else if (uVar7 == uVar1) {
          uVar6 = uVar6 + 1;
          dst->runs[(long)dst->n_runs + -1] = (rle16_t)(uVar6 * 0x10000 | (uint)rVar5 & 0xffff);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < src_1->cardinality);
    }
  }
  else if ((int)uVar7 < src_2->n_runs) {
    lVar8 = (long)(int)uVar7;
    do {
      rVar12 = src_2->runs[lVar8];
      uVar7 = (uint)rVar5 & 0xffff;
      if (uVar7 + (uVar6 & 0xffff) + 1 < ((uint)rVar12 & 0xffff)) {
        prVar3 = dst->runs;
        iVar2 = dst->n_runs;
        prVar3[iVar2].value = rVar12.value;
        prVar3[iVar2].length = rVar12.length;
        dst->n_runs = iVar2 + 1;
        rVar5 = rVar12;
        uVar6 = (uint)rVar12 >> 0x10;
      }
      else {
        uVar9 = ((uint)rVar12 & 0xffff) + ((uint)rVar12 >> 0x10);
        if ((uVar6 & 0xffff) + uVar7 <= uVar9) {
          uVar6 = uVar9 - uVar7;
          dst->runs[(long)dst->n_runs + -1] = (rle16_t)(uVar6 * 0x10000 | uVar7);
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < src_2->n_runs);
  }
  return;
}

Assistant:

void array_run_container_union(const array_container_t *src_1,
                               const run_container_t *src_2,
                               run_container_t *dst) {
    if (run_container_is_full(src_2)) {
        run_container_copy(src_2, dst);
        return;
    }
    // TODO: see whether the "2*" is spurious
    run_container_grow(dst, 2 * (src_1->cardinality + src_2->n_runs), false);
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    rle16_t previousrle;
    if (src_2->runs[rlepos].value <= src_1->array[arraypos]) {
        previousrle = run_container_append_first(dst, src_2->runs[rlepos]);
        rlepos++;
    } else {
        previousrle =
            run_container_append_value_first(dst, src_1->array[arraypos]);
        arraypos++;
    }
    while ((rlepos < src_2->n_runs) && (arraypos < src_1->cardinality)) {
        if (src_2->runs[rlepos].value <= src_1->array[arraypos]) {
            run_container_append(dst, src_2->runs[rlepos], &previousrle);
            rlepos++;
        } else {
            run_container_append_value(dst, src_1->array[arraypos],
                                       &previousrle);
            arraypos++;
        }
    }
    if (arraypos < src_1->cardinality) {
        while (arraypos < src_1->cardinality) {
            run_container_append_value(dst, src_1->array[arraypos],
                                       &previousrle);
            arraypos++;
        }
    } else {
        while (rlepos < src_2->n_runs) {
            run_container_append(dst, src_2->runs[rlepos], &previousrle);
            rlepos++;
        }
    }
}